

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlNodeBufGetContent(xmlBufferPtr buffer,xmlNode *cur)

{
  int iVar1;
  int iVar2;
  xmlBufPtr buf_00;
  int ret2;
  int ret1;
  xmlBufPtr buf;
  xmlNode *cur_local;
  xmlBufferPtr buffer_local;
  
  if ((cur == (xmlNode *)0x0) || (buffer == (xmlBufferPtr)0x0)) {
    buffer_local._4_4_ = -1;
  }
  else {
    buf_00 = xmlBufFromBuffer(buffer);
    iVar1 = xmlBufGetNodeContent(buf_00,cur);
    iVar2 = xmlBufBackToBuffer(buf_00,buffer);
    if ((iVar1 < 0) || (iVar2 < 0)) {
      buffer_local._4_4_ = -1;
    }
    else {
      buffer_local._4_4_ = 0;
    }
  }
  return buffer_local._4_4_;
}

Assistant:

int
xmlNodeBufGetContent(xmlBufferPtr buffer, const xmlNode *cur)
{
    xmlBufPtr buf;
    int ret1, ret2;

    if ((cur == NULL) || (buffer == NULL)) return(-1);
    buf = xmlBufFromBuffer(buffer);
    ret1 = xmlBufGetNodeContent(buf, cur);
    ret2 = xmlBufBackToBuffer(buf, buffer);
    if ((ret1 < 0) || (ret2 < 0))
        return(-1);
    return(0);
}